

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::neg(Literal *__return_storage_ptr__,Literal *this)

{
  BasicType BVar1;
  Literal local_58;
  Literal local_30;
  Literal *local_18;
  Literal *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  BVar1 = wasm::Type::getBasic(&this->type);
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                       ,0x35a);
  case i32:
    Literal(__return_storage_ptr__,-(this->field_0).i32);
    break;
  case i64:
    Literal(__return_storage_ptr__,-(this->field_0).i64);
    break;
  case f32:
    Literal(&local_30,(this->field_0).i32 + 0x80000000);
    castToF32(__return_storage_ptr__,&local_30);
    ~Literal(&local_30);
    break;
  case f64:
    Literal(&local_58,(this->field_0).func.super_IString.str._M_len ^ 0x8000000000000000);
    castToF64(__return_storage_ptr__,&local_58);
    ~Literal(&local_58);
    break;
  default:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                       ,0x35c);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::neg() const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(-uint32_t(i32));
    case Type::i64:
      return Literal(-uint64_t(i64));
    case Type::f32:
      return Literal(i32 ^ 0x80000000).castToF32();
    case Type::f64:
      return Literal(int64_t(i64 ^ 0x8000000000000000ULL)).castToF64();
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("invalid type");
}